

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_strcasecmp(char *s1,char *s2)

{
  u_char uVar1;
  byte *local_38;
  u_char *us2;
  u_char *us1;
  u_char *cm;
  char *s2_local;
  char *s1_local;
  
  local_38 = (byte *)s2;
  us2 = (u_char *)s1;
  do {
    if (""[*us2] != ""[*local_38]) {
      return (uint)""[*us2] - (uint)""[*local_38];
    }
    uVar1 = *us2;
    local_38 = local_38 + 1;
    us2 = us2 + 1;
  } while (uVar1 != '\0');
  return 0;
}

Assistant:

int
pcap_strcasecmp(const char *s1, const char *s2)
{
	register const u_char	*cm = charmap,
				*us1 = (const u_char *)s1,
				*us2 = (const u_char *)s2;

	while (cm[*us1] == cm[*us2++])
		if (*us1++ == '\0')
			return(0);
	return (cm[*us1] - cm[*--us2]);
}